

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TextureInfo prop,
               aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  char *pcVar1;
  Texture *pTVar2;
  long lVar3;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *pvVar4;
  bool bVar5;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  aiString id;
  aiString name;
  uint local_c44;
  uint local_c40;
  aiString local_c3c;
  aiString local_838;
  aiString local_434;
  
  pvVar6 = prop.texture.vector;
  if ((prop.texture.vector != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) &&
     (uVar14 = (ulong)prop.texture.index,
     (((prop.texture.vector)->
      super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar14]->source).vector !=
     (vector<glTF2::Image_*,_std::allocator<glTF2::Image_*>_> *)0x0)) {
    pTVar2 = ((prop.texture.vector)->
             super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar14];
    lVar3 = *(long *)(*(long *)&(((pTVar2->source).vector)->
                                super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>)
                                ._M_impl + (ulong)(pTVar2->source).index * 8);
    uVar9 = *(ulong *)(lVar3 + 0x58);
    sVar13 = 0x3ff;
    if ((uVar9 & 0xfffffc00) == 0) {
      sVar13 = uVar9 & 0xffffffff;
    }
    local_c3c.length = (ai_uint32)sVar13;
    memcpy(local_c3c.data,*(void **)(lVar3 + 0x50),sVar13);
    local_c3c.data[sVar13] = '\0';
    iVar7 = (embeddedTexIdxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start
            [((pvVar6->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar14]->source).index];
    if (iVar7 != -1) {
      local_c3c.data[0] = '*';
      if (iVar7 < 0) {
        pcVar12 = local_c3c.data + 2;
        local_c3c.data[1] = '-';
        iVar7 = -iVar7;
        local_c3c.length = 2;
      }
      else {
        pcVar12 = local_c3c.data + 1;
        local_c3c.length = 1;
      }
      iVar10 = 1000000000;
      bVar11 = false;
      do {
        if (0x3fe < local_c3c.length) break;
        iVar8 = iVar7 % iVar10;
        if (((bVar11) || (iVar10 == 1)) || ((int)((long)iVar7 / (long)iVar10) != 0)) {
          pcVar1 = pcVar12 + 1;
          local_c3c.length = local_c3c.length + 1;
          *pcVar12 = (char)((long)iVar7 / (long)iVar10) + '0';
          bVar11 = true;
          pcVar12 = pcVar1;
          iVar7 = iVar8;
          if (iVar10 != 1) goto LAB_00681562;
          bVar5 = false;
          iVar10 = 1;
        }
        else {
LAB_00681562:
          iVar10 = iVar10 / 10;
          bVar5 = true;
        }
      } while (bVar5);
      *pcVar12 = '\0';
    }
    aiMaterial::AddProperty(mat,&local_c3c,"$tex.file",texType,texSlot);
    aiMaterial::AddBinaryProperty
              (mat,&prop.texCoord,4,"$tex.file.texCoord",texType,texSlot,aiPTI_Buffer);
    pTVar2 = ((prop.texture.vector)->
             super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[prop.texture.index];
    pvVar4 = (pTVar2->sampler).vector;
    if (pvVar4 != (vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *)0x0) {
      uVar9 = (ulong)(pTVar2->sampler).index;
      lVar3 = *(long *)(*(long *)&(pvVar4->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + uVar9 * 8);
      uVar14 = *(ulong *)(lVar3 + 0x38);
      sVar13 = uVar14 & 0xffffffff;
      if ((uVar14 & 0xfffffc00) != 0) {
        sVar13 = 0x3ff;
      }
      local_434.length = (ai_uint32)sVar13;
      memcpy(local_434.data,*(void **)(lVar3 + 0x30),sVar13);
      local_434.data[sVar13] = '\0';
      lVar3 = *(long *)(*(long *)&(pvVar4->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + uVar9 * 8);
      uVar14 = *(ulong *)(lVar3 + 0x18);
      sVar13 = 0x3ff;
      if ((uVar14 & 0xfffffc00) == 0) {
        sVar13 = uVar14 & 0xffffffff;
      }
      local_838.length = (ai_uint32)sVar13;
      memcpy(local_838.data,*(void **)(lVar3 + 0x10),sVar13);
      local_838.data[sVar13] = '\0';
      aiMaterial::AddProperty(mat,&local_434,"$tex.mappingname",texType,texSlot);
      aiMaterial::AddProperty(mat,&local_838,"$tex.mappingid",texType,texSlot);
      lVar3 = *(long *)(*(long *)&(pvVar4->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + uVar9 * 8);
      iVar7 = *(int *)(lVar3 + 0x58);
      local_c40 = (uint)(iVar7 == 0x812f);
      if (iVar7 == 0x8370) {
        local_c40 = 2;
      }
      iVar7 = *(int *)(lVar3 + 0x5c);
      local_c44 = (uint)(iVar7 == 0x812f);
      if (iVar7 == 0x8370) {
        local_c44 = 2;
      }
      aiMaterial::AddBinaryProperty(mat,&local_c40,4,"$tex.mapmodeu",texType,texSlot,aiPTI_Buffer);
      aiMaterial::AddBinaryProperty(mat,&local_c44,4,"$tex.mapmodev",texType,texSlot,aiPTI_Buffer);
      lVar3 = *(long *)(*(long *)&(pvVar4->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + uVar9 * 8);
      if (*(int *)(lVar3 + 0x50) != 0) {
        aiMaterial::AddBinaryProperty
                  (mat,(void *)(lVar3 + 0x50),4,"$tex.mappingfiltermag",texType,texSlot,aiPTI_Buffer
                  );
      }
      lVar3 = *(long *)(*(long *)&(pvVar4->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + uVar9 * 8);
      if (*(int *)(lVar3 + 0x54) != 0) {
        aiMaterial::AddBinaryProperty
                  (mat,(void *)(lVar3 + 0x54),4,"$tex.mappingfiltermin",texType,texSlot,aiPTI_Buffer
                  );
      }
    }
  }
  return;
}

Assistant:

static inline void SetFace(aiFace& face, int a, int b)
{
    face.mNumIndices = 2;
    face.mIndices = new unsigned int[2];
    face.mIndices[0] = a;
    face.mIndices[1] = b;
}